

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_markable.cpp
# Opt level: O1

void nested_markable::test_opt_opt_int(void)

{
  return;
}

Assistant:

void test_opt_opt_int()
  {
    static_assert(sizeof(optopt_int) == sizeof(int), "excessive size");
    optopt_int ooi {};
    assert(!ooi.has_value());
    assert(-2 == ooi.representation_value());


    opt_int oi {};
    assert(-1 == oi.representation_value());
    assert(!oi.has_value());

    ooi.assign(oi);
    assert(ooi.has_value());
    assert(!ooi.value().has_value());
    assert(-1 == ooi.representation_value());

    ooi.assign(opt_int{1});
    assert(ooi.has_value());
    assert(ooi.value().has_value());
    assert(ooi.value().value() == true);
    assert(1 == ooi.representation_value());
  }